

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantize.c
# Opt level: O2

int fits_img_stats_float
              (float *array,long nx,long ny,int nullcheck,float nullvalue,long *ngoodpix,
              float *minvalue,float *maxvalue,double *mean,double *sigma,double *noise1,
              double *noise2,double *noise3,double *noise5,int *status)

{
  float *array_00;
  double *__base;
  ulong uVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  ulong npix;
  float *pfVar5;
  double dVar6;
  size_t sVar7;
  size_t sVar8;
  long lVar9;
  int iVar10;
  ulong npix_00;
  float fVar11;
  float fVar12;
  float maxval;
  undefined4 uStack_ac;
  float minval;
  undefined4 uStack_a4;
  size_t local_a0;
  double local_98;
  long ngood;
  long *local_88;
  float *local_80;
  double *local_78;
  double xnoise5;
  double xnoise3;
  double xnoise2;
  double xsigma;
  double xmean;
  long local_48;
  size_t local_40;
  size_t local_38;
  
  xmean = 0.0;
  xsigma = 0.0;
  xnoise2 = 0.0;
  xnoise3 = 0.0;
  xnoise5 = 0.0;
  if (mean != (double *)0x0 || sigma != (double *)0x0) {
    FnMeanSigma_float(array,ny * nx,nullcheck,nullvalue,&ngood,&xmean,&xsigma,status);
    if (ngoodpix != (long *)0x0) {
      *ngoodpix = ngood;
    }
    if (mean != (double *)0x0) {
      *mean = xmean;
    }
    if (sigma != (double *)0x0) {
      *sigma = xsigma;
    }
  }
  if (noise1 == (double *)0x0) goto LAB_001a6dc0;
  dVar6 = 0.0;
  if (2 < nx) {
    local_a0 = ny;
    array_00 = (float *)calloc(nx,4);
    ny = local_a0;
    if (array_00 == (float *)0x0) {
      *status = 0x71;
    }
    else {
      __base = (double *)calloc(local_a0,8);
      local_78 = __base;
      if (__base != (double *)0x0) {
        sVar7 = 0;
        sVar8 = 0;
        if (0 < ny) {
          sVar8 = ny;
        }
        lVar9 = nx * 4;
        dVar6 = 0.0;
        pfVar5 = array;
        local_88 = ngoodpix;
        local_80 = minvalue;
        local_48 = lVar9;
        local_40 = sVar8;
        for (; minvalue = local_80, ngoodpix = local_88, sVar7 != sVar8; sVar7 = sVar7 + 1) {
          if (nullcheck == 0) {
            fVar11 = array[sVar7 * nx];
            lVar4 = 0;
LAB_001a6b22:
            npix_00 = 0;
            while( true ) {
              lVar2 = lVar4 + 1;
              if (nx <= lVar2) break;
              if (nullcheck == 0) {
                fVar12 = (array + sVar7 * nx)[lVar4 + 1];
              }
              else {
                while( true ) {
                  if (nx <= lVar2) goto LAB_001a6b64;
                  fVar12 = pfVar5[lVar2];
                  if ((fVar12 != nullvalue) || (NAN(fVar12) || NAN(nullvalue))) break;
                  lVar2 = lVar2 + 1;
                }
              }
              array_00[npix_00] = fVar11 - fVar12;
              npix_00 = npix_00 + 1;
              lVar4 = lVar2;
              fVar11 = fVar12;
            }
LAB_001a6b64:
            if (1 < npix_00) {
              local_98 = dVar6;
              local_38 = sVar7;
              FnMeanSigma_float(array_00,npix_00,0,0.0,(long *)0x0,(double *)&minval,
                                (double *)&maxval,status);
              dVar6 = (double)CONCAT44(uStack_ac,maxval);
              if (0.0 < dVar6) {
                for (iVar10 = 0; iVar10 != 3; iVar10 = iVar10 + 1) {
                  uVar1 = 0;
                  if (0 < (long)npix_00) {
                    uVar1 = npix_00;
                  }
                  npix = 0;
                  for (uVar3 = 0; uVar1 != uVar3; uVar3 = uVar3 + 1) {
                    if (ABS((double)array_00[uVar3] - (double)CONCAT44(uStack_a4,minval)) <
                        dVar6 * 5.0) {
                      if ((long)npix < (long)uVar3) {
                        array_00[npix] = array_00[uVar3];
                      }
                      npix = npix + 1;
                    }
                  }
                  if (npix == npix_00) break;
                  FnMeanSigma_float(array_00,npix,0,0.0,(long *)0x0,(double *)&minval,
                                    (double *)&maxval,status);
                  dVar6 = (double)CONCAT44(uStack_ac,maxval);
                  npix_00 = npix;
                }
              }
              local_78[(long)local_98] = dVar6;
              dVar6 = (double)((long)local_98 + 1);
              __base = local_78;
              sVar7 = local_38;
              sVar8 = local_40;
              lVar9 = local_48;
            }
          }
          else {
            for (lVar4 = 0; nx != lVar4; lVar4 = lVar4 + 1) {
              fVar11 = pfVar5[lVar4];
              if ((fVar11 != nullvalue) || (NAN(fVar11) || NAN(nullvalue))) goto LAB_001a6b22;
            }
          }
          pfVar5 = (float *)((long)pfVar5 + lVar9);
        }
        if (dVar6 == 0.0) {
          local_98 = 0.0;
        }
        else if (dVar6 == 4.94065645841247e-324) {
          local_98 = *__base;
        }
        else {
          qsort(__base,(size_t)dVar6,8,FnCompare_double);
          local_98 = (__base[(long)((long)dVar6 - 1U) / 2] + __base[(long)dVar6 / 2]) * 0.5;
        }
        local_98 = local_98 * 0.70710678;
        free(__base);
        free(array_00);
        ny = local_a0;
        dVar6 = local_98;
        goto LAB_001a6dbc;
      }
      free(array_00);
      *status = 0x71;
    }
    dVar6 = 0.0;
  }
LAB_001a6dbc:
  *noise1 = dVar6;
LAB_001a6dc0:
  if ((minvalue != (float *)0x0 || maxvalue != (float *)0x0) || noise3 != (double *)0x0) {
    FnNoise5_float(array,nx,ny,nullcheck,nullvalue,&ngood,&minval,&maxval,&xnoise2,&xnoise3,&xnoise5
                   ,status);
    if (ngoodpix != (long *)0x0) {
      *ngoodpix = ngood;
    }
    if (minvalue != (float *)0x0) {
      *minvalue = minval;
    }
    if (maxvalue != (float *)0x0) {
      *maxvalue = maxval;
    }
    if (noise2 != (double *)0x0) {
      *noise2 = xnoise2;
    }
    if (noise3 != (double *)0x0) {
      *noise3 = xnoise3;
    }
    if (noise5 != (double *)0x0) {
      *noise5 = xnoise5;
    }
  }
  return *status;
}

Assistant:

int fits_img_stats_float(float *array, /*  2 dimensional array of image pixels */
        long nx,            /* number of pixels in each row of the image */
	long ny,            /* number of rows in the image */
	                    /* (if this is a 3D image, then ny should be the */
			    /* product of the no. of rows times the no. of planes) */
	int nullcheck,      /* check for null values, if true */
	float nullvalue,    /* value of null pixels, if nullcheck is true */

   /* returned parameters (if the pointer is not null)  */
	long *ngoodpix,     /* number of non-null pixels in the image */
	float *minvalue,    /* returned minimum non-null value in the array */
	float *maxvalue,    /* returned maximum non-null value in the array */
	double *mean,       /* returned mean value of all non-null pixels */
	double *sigma,      /* returned R.M.S. value of all non-null pixels */
	double *noise1,     /* 1st order estimate of noise in image background level */
	double *noise2,     /* 2nd order estimate of noise in image background level */
	double *noise3,     /* 3rd order estimate of noise in image background level */
	double *noise5,     /* 5th order estimate of noise in image background level */
	int *status)        /* error status */

/*
    Compute statistics of the input float image.
*/
{
	long ngood;
	float minval, maxval;
	double xmean = 0., xsigma = 0., xnoise = 0., xnoise2 = 0., xnoise3 = 0., xnoise5 = 0.;

	/* need to calculate mean and/or sigma and/or limits? */
	if (mean || sigma ) {
		FnMeanSigma_float(array, nx * ny, nullcheck, nullvalue, 
			&ngood, &xmean, &xsigma, status);

	    if (ngoodpix) *ngoodpix = ngood;
	    if (mean)     *mean = xmean;
	    if (sigma)    *sigma = xsigma;
	}

	if (noise1) {
		FnNoise1_float(array, nx, ny, nullcheck, nullvalue, 
		  &xnoise, status);

		*noise1  = xnoise;
	}

	if (minvalue || maxvalue || noise3) {
		FnNoise5_float(array, nx, ny, nullcheck, nullvalue, 
			&ngood, &minval, &maxval, &xnoise2, &xnoise3, &xnoise5, status);

		if (ngoodpix) *ngoodpix = ngood;
		if (minvalue) *minvalue= minval;
		if (maxvalue) *maxvalue = maxval;
		if (noise2) *noise2  = xnoise2;
		if (noise3) *noise3  = xnoise3;
		if (noise5) *noise5  = xnoise5;
	}
	return(*status);
}